

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O3

int writeString(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json
               )

{
  CURLINFO CVar1;
  writeoutid wVar2;
  undefined4 uVar3;
  int iVar4;
  CURLcode CVar5;
  long lVar6;
  curl_certinfo *pcVar7;
  size_t sVar8;
  char *pcVar9;
  int *piVar10;
  ulong uVar11;
  char *pcVar12;
  curl_slist *pcVar13;
  char *pcVar14;
  long version;
  dynbuf buf;
  char *local_78;
  FILE *local_70;
  char *local_68;
  char *local_60;
  size_t local_58;
  dynbuf local_50;
  
  local_78 = (char *)0x0;
  curlx_dyn_init(&local_50,0x40000);
  CVar1 = wovar->ci;
  local_70 = (FILE *)stream;
  if (CVar1 == CURLINFO_NONE) {
    wVar2 = wovar->id;
    if (wVar2 - VAR_INPUT_URLSCHEME < 0x14) {
      if ((per->this_url == (char *)0x0) || (lVar6 = curl_url(), lVar6 == 0)) goto LAB_0011de1b;
      local_60 = (char *)0x0;
      local_68 = (char *)0x0;
      if (wVar2 < VAR_INPUT_URLESCHEME) {
        local_68 = per->this_url;
LAB_0011dde8:
        uVar3 = *(undefined4 *)("urle.user" + (long)(int)wVar2 * 4 + 9);
        iVar4 = curl_url_set(lVar6,0,local_68,0x208);
        if (iVar4 == 0) {
          iVar4 = curl_url_get(lVar6,uVar3,&local_60,1);
          pcVar12 = local_60;
          if (local_60 != (char *)0x0 && iVar4 == 0) {
            local_78 = local_60;
            curl_url_cleanup(lVar6);
            stream = (FILE *)local_70;
            pcVar14 = pcVar12;
            goto LAB_0011de4e;
          }
          curl_url_cleanup(lVar6);
          if (iVar4 == 0) {
            pcVar14 = (char *)0x0;
            pcVar12 = local_78;
            goto LAB_0011e047;
          }
          goto LAB_0011de1b;
        }
      }
      else {
        iVar4 = curl_easy_getinfo(per->curl,0x100001,&local_68);
        if (iVar4 == 0) goto LAB_0011dde8;
      }
      curl_url_cleanup(lVar6);
    }
    else if ((int)wVar2 < 10) {
      if (wVar2 == VAR_CERT) {
        certinfo(per);
        pcVar7 = per->certinfo;
        if (pcVar7 != (curl_certinfo *)0x0) {
          uVar11 = (ulong)(uint)pcVar7->num_of_certs;
          if (0 < pcVar7->num_of_certs) {
            lVar6 = 0;
            do {
              while (pcVar13 = pcVar7->certinfo[lVar6], pcVar13 == (curl_slist *)0x0) {
                lVar6 = lVar6 + 1;
                if ((int)uVar11 <= lVar6) goto LAB_0011e003;
              }
              do {
                iVar4 = curl_strnequal(pcVar13->data,"cert:",5);
                pcVar14 = pcVar13->data;
                if (iVar4 != 0) {
                  pcVar14 = pcVar14 + 5;
                }
                CVar5 = curlx_dyn_add(&local_50,pcVar14);
                if ((CVar5 != CURLE_OK) ||
                   (((sVar8 = curlx_dyn_len(&local_50), sVar8 != 0 &&
                     (local_58 = sVar8, pcVar14 = curlx_dyn_ptr(&local_50),
                     pcVar14[local_58 - 1] != '\n')) &&
                    (CVar5 = curlx_dyn_addn(&local_50,"\n",1), CVar5 != CURLE_OK))))
                goto LAB_0011de1b;
                pcVar13 = pcVar13->next;
              } while (pcVar13 != (curl_slist *)0x0);
              pcVar7 = per->certinfo;
              uVar11 = (ulong)pcVar7->num_of_certs;
              lVar6 = lVar6 + 1;
            } while (lVar6 < (long)uVar11);
          }
LAB_0011e003:
          pcVar9 = curlx_dyn_ptr(&local_50);
          pcVar14 = "";
          pcVar12 = "";
          if (pcVar9 != (char *)0x0) {
            pcVar14 = pcVar9;
            pcVar12 = pcVar9;
          }
LAB_0011e047:
          local_78 = pcVar12;
          pcVar12 = (char *)0x0;
          stream = (FILE *)local_70;
          goto LAB_0011de4e;
        }
        local_78 = "";
      }
      else if (wVar2 == VAR_EFFECTIVE_FILENAME) {
        pcVar14 = (per->outs).filename;
LAB_0011dec0:
        pcVar12 = pcVar14;
        if (pcVar14 != (char *)0x0) goto LAB_0011e047;
      }
    }
    else if (wVar2 == VAR_ERRORMSG) {
      if (per_result != CURLE_OK) {
        pcVar14 = per->errorbuffer;
        if ((pcVar14 == (char *)0x0) || (pcVar12 = pcVar14, *pcVar14 == '\0')) {
          pcVar14 = (char *)curl_easy_strerror(per_result);
          pcVar12 = pcVar14;
        }
        goto LAB_0011e047;
      }
    }
    else if (wVar2 == VAR_INPUT_URL) {
      pcVar14 = per->this_url;
      goto LAB_0011dec0;
    }
  }
  else if (CVar1 == CURLINFO_HTTP_VERSION) {
    local_60 = (char *)0x0;
    iVar4 = curl_easy_getinfo(per->curl,0x20002e);
    if (iVar4 == 0) {
      if (local_60 == (char *)0x0) {
        pcVar14 = "0";
      }
      else {
        piVar10 = &http_version[1].num;
        do {
          pcVar14 = ((httpmap *)(piVar10 + -2))->str;
          if (pcVar14 == (char *)0x0) goto LAB_0011de1b;
          iVar4 = *piVar10;
          piVar10 = piVar10 + 4;
        } while (local_60 != (char *)(long)iVar4);
      }
      pcVar12 = (char *)0x0;
      local_78 = pcVar14;
LAB_0011de4e:
      if (use_json) {
        curl_mfprintf(stream,"\"%s\":",wovar->name);
        jsonWriteString(stream,local_78,false);
      }
      else {
        fputs(pcVar14,(FILE *)stream);
      }
      goto LAB_0011de82;
    }
  }
  else {
    pcVar12 = (char *)0x0;
    iVar4 = curl_easy_getinfo(per->curl,CVar1,&local_78);
    stream = (FILE *)local_70;
    pcVar14 = local_78;
    if (iVar4 == 0 && local_78 != (char *)0x0) goto LAB_0011de4e;
  }
LAB_0011de1b:
  if (use_json) {
    pcVar12 = (char *)0x0;
    curl_mfprintf(local_70,"\"%s\":null",wovar->name);
  }
  else {
    pcVar12 = (char *)0x0;
  }
LAB_0011de82:
  curl_free(pcVar12);
  curlx_dyn_free(&local_50);
  return 1;
}

Assistant:

static int writeString(FILE *stream, const struct writeoutvar *wovar,
                       struct per_transfer *per, CURLcode per_result,
                       bool use_json)
{
  bool valid = false;
  const char *strinfo = NULL;
  const char *freestr = NULL;
  struct dynbuf buf;
  curlx_dyn_init(&buf, 256*1024);

  DEBUGASSERT(wovar->writefunc == writeString);

  if(wovar->ci) {
    if(wovar->ci == CURLINFO_HTTP_VERSION) {
      long version = 0;
      if(!curl_easy_getinfo(per->curl, CURLINFO_HTTP_VERSION, &version)) {
        const struct httpmap *m = &http_version[0];
        while(m->str) {
          if(m->num == version) {
            strinfo = m->str;
            valid = true;
            break;
          }
          m++;
        }
      }
    }
    else {
      if(!curl_easy_getinfo(per->curl, wovar->ci, &strinfo) && strinfo)
        valid = true;
    }
  }
  else {
    switch(wovar->id) {
    case VAR_CERT:
      certinfo(per);
      if(per->certinfo) {
        int i;
        bool error = FALSE;
        for(i = 0; (i < per->certinfo->num_of_certs) && !error; i++) {
          struct curl_slist *slist;

          for(slist = per->certinfo->certinfo[i]; slist; slist = slist->next) {
            size_t len;
            if(curl_strnequal(slist->data, "cert:", 5)) {
              if(curlx_dyn_add(&buf, &slist->data[5])) {
                error = TRUE;
                break;
              }
            }
            else {
              if(curlx_dyn_add(&buf, slist->data)) {
                error = TRUE;
                break;
              }
            }
            len = curlx_dyn_len(&buf);
            if(len) {
              char *ptr = curlx_dyn_ptr(&buf);
              if(ptr[len -1] != '\n') {
                /* add a newline to make things look better */
                if(curlx_dyn_addn(&buf, "\n", 1)) {
                  error = TRUE;
                  break;
                }
              }
            }
          }
        }
        if(!error) {
          strinfo = curlx_dyn_ptr(&buf);
          if(!strinfo)
            /* maybe not a TLS protocol */
            strinfo = "";
          valid = true;
        }
      }
      else
        strinfo = ""; /* no cert info */
      break;
    case VAR_ERRORMSG:
      if(per_result) {
        strinfo = (per->errorbuffer && per->errorbuffer[0]) ?
          per->errorbuffer : curl_easy_strerror(per_result);
        valid = true;
      }
      break;
    case VAR_EFFECTIVE_FILENAME:
      if(per->outs.filename) {
        strinfo = per->outs.filename;
        valid = true;
      }
      break;
    case VAR_INPUT_URL:
      if(per->this_url) {
        strinfo = per->this_url;
        valid = true;
      }
      break;
    case VAR_INPUT_URLSCHEME:
    case VAR_INPUT_URLUSER:
    case VAR_INPUT_URLPASSWORD:
    case VAR_INPUT_URLOPTIONS:
    case VAR_INPUT_URLHOST:
    case VAR_INPUT_URLPORT:
    case VAR_INPUT_URLPATH:
    case VAR_INPUT_URLQUERY:
    case VAR_INPUT_URLFRAGMENT:
    case VAR_INPUT_URLZONEID:
    case VAR_INPUT_URLESCHEME:
    case VAR_INPUT_URLEUSER:
    case VAR_INPUT_URLEPASSWORD:
    case VAR_INPUT_URLEOPTIONS:
    case VAR_INPUT_URLEHOST:
    case VAR_INPUT_URLEPORT:
    case VAR_INPUT_URLEPATH:
    case VAR_INPUT_URLEQUERY:
    case VAR_INPUT_URLEFRAGMENT:
    case VAR_INPUT_URLEZONEID:
      if(per->this_url) {
        if(!urlpart(per, wovar->id, &strinfo)) {
          freestr = strinfo;
          valid = true;
        }
      }
      break;
    default:
      DEBUGASSERT(0);
      break;
    }
  }

  if(valid) {
    DEBUGASSERT(strinfo);
    if(use_json) {
      fprintf(stream, "\"%s\":", wovar->name);
      jsonWriteString(stream, strinfo, FALSE);
    }
    else
      fputs(strinfo, stream);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }
  curl_free((char *)freestr);

  curlx_dyn_free(&buf);
  return 1; /* return 1 if anything was written */
}